

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O3

void file_uncompress(char *file)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  gzFile pgVar6;
  FILE *pFVar7;
  char *pcVar8;
  char *in_RSI;
  char *pcVar9;
  gzFile unaff_R12;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  char *__s1;
  bool bVar13;
  char buf [1024];
  undefined4 uStack_470;
  undefined1 uStack_46c;
  char *pcStack_458;
  gzFile pgStack_450;
  char acStack_428 [1032];
  
  pcVar12 = acStack_428;
  sVar5 = strlen(file);
  if (sVar5 - 0x3fd < 0xfffffffffffffc00) {
    file_uncompress_cold_3();
LAB_001017ee:
    pgVar6 = unaff_R12;
    file_uncompress_cold_2();
  }
  else {
    unaff_R12 = (gzFile)0x400;
    snprintf(acStack_428,0x400,"%s",file);
    if ((sVar5 < 4) || (iVar3 = strcmp(file + (sVar5 - 3),".gz"), iVar3 != 0)) {
      unaff_R12 = (gzFile)(0x400 - sVar5);
      snprintf(acStack_428 + sVar5,(size_t)unaff_R12,"%s",".gz");
      pcVar9 = acStack_428;
      pcVar12 = file;
    }
    else {
      acStack_428[sVar5 - 3] = '\0';
      pcVar9 = file;
    }
    in_RSI = "rb";
    pgVar6 = (gzFile)gzopen(pcVar9);
    if (pgVar6 == (gzFile)0x0) goto LAB_001017ee;
    in_RSI = "wb";
    pFVar7 = fopen(pcVar12,"wb");
    if (pFVar7 != (FILE *)0x0) {
      gz_uncompress(pgVar6,(FILE *)pFVar7);
      unlink(pcVar9);
      return;
    }
  }
  pcVar9 = file;
  file_uncompress_cold_1();
  uVar11 = (ulong)pcVar9 & 0xffffffff;
  uStack_46c = 0;
  uStack_470 = 0x20366277;
  pcVar12 = *(char **)in_RSI;
  prog = pcVar12;
  pcStack_458 = file;
  pgStack_450 = pgVar6;
  pcVar8 = strrchr(pcVar12,0x2f);
  __s1 = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    __s1 = pcVar12;
  }
  iVar3 = strcmp(__s1,"gunzip");
  if (iVar3 == 0) {
    bVar13 = true;
    bVar1 = false;
  }
  else {
    iVar3 = strcmp(__s1,"zcat");
    bVar13 = iVar3 == 0;
    bVar1 = bVar13;
  }
  in_RSI = in_RSI + 8;
  iVar3 = (int)pcVar9 + -1;
  if ((int)pcVar9 < 2) {
LAB_00101936:
    uStack_470 = uStack_470 & 0xffffff;
  }
  else {
    cVar2 = ' ';
    do {
      pcVar12 = *(char **)in_RSI;
      if (*pcVar12 != '-') goto LAB_00101932;
      if ((pcVar12[1] == 'c') && (pcVar12[2] == '\0')) {
        bVar1 = true;
      }
      else if ((pcVar12[1] == 'd') && (pcVar12[2] == '\0')) {
        bVar13 = true;
      }
      else if ((pcVar12[1] == 'f') && (pcVar12[2] == '\0')) {
        uStack_470 = CONCAT13(0x66,(undefined3)uStack_470);
        cVar2 = 'f';
      }
      else if ((pcVar12[1] == 'h') && (pcVar12[2] == '\0')) {
        uStack_470 = CONCAT13(0x68,(undefined3)uStack_470);
        cVar2 = 'h';
      }
      else if ((pcVar12[1] == 'r') && (pcVar12[2] == '\0')) {
        uStack_470 = CONCAT13(0x52,(undefined3)uStack_470);
        cVar2 = 'R';
      }
      else {
        if (8 < (byte)(pcVar12[1] - 0x31U)) goto LAB_00101932;
        if (pcVar12[2] != '\0') {
          iVar3 = (int)uVar11 + -1;
          goto LAB_00101932;
        }
        uStack_470._0_3_ = CONCAT12(pcVar12[1],(undefined2)uStack_470);
      }
      in_RSI = in_RSI + 8;
      iVar3 = iVar3 + -1;
      uVar10 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar10;
    } while (1 < (int)uVar10);
    iVar3 = 0;
LAB_00101932:
    if (cVar2 == ' ') goto LAB_00101936;
  }
  if (iVar3 == 0) {
    if (bVar13) {
      iVar3 = fileno(_stdin);
      pgVar6 = (gzFile)gzdopen(iVar3,"rb");
      if (pgVar6 == (gzFile)0x0) {
LAB_00101a6e:
        main_cold_3();
LAB_00101a73:
        main_cold_4();
        return;
      }
      gz_uncompress(pgVar6,(FILE *)_stdout);
    }
    else {
      iVar3 = fileno(_stdout);
      pgVar6 = (gzFile)gzdopen(iVar3,&uStack_470);
      if (pgVar6 == (gzFile)0x0) goto LAB_00101a73;
      gz_compress((FILE *)_stdin,pgVar6);
    }
  }
  else {
    do {
      pcVar12 = *(char **)in_RSI;
      if (bVar13) {
        if (bVar1) {
          pgVar6 = (gzFile)gzopen(pcVar12,"rb");
          if (pgVar6 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar6,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar12);
        }
      }
      else if (bVar1) {
        pFVar7 = fopen(pcVar12,"rb");
        if (pFVar7 == (FILE *)0x0) {
          perror(*(char **)in_RSI);
        }
        else {
          iVar4 = fileno(_stdout);
          pgVar6 = (gzFile)gzdopen(iVar4,&uStack_470);
          if (pgVar6 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101a6e;
          }
          gz_compress((FILE *)pFVar7,pgVar6);
        }
      }
      else {
        file_compress(pcVar12,(char *)&uStack_470);
      }
      in_RSI = in_RSI + 8;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void file_uncompress(file)
    char  *file;
{
    local char buf[MAX_NAME_LEN];
    char *infile, *outfile;
    FILE  *out;
    gzFile in;
    size_t len = strlen(file);

    if (len + strlen(GZ_SUFFIX) >= sizeof(buf)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(buf, sizeof(buf), "%s", file);
#else
    strcpy(buf, file);
#endif

    if (len > SUFFIX_LEN && strcmp(file+len-SUFFIX_LEN, GZ_SUFFIX) == 0) {
        infile = file;
        outfile = buf;
        outfile[len-3] = '\0';
    } else {
        outfile = file;
        infile = buf;
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
        snprintf(buf + len, sizeof(buf) - len, "%s", GZ_SUFFIX);
#else
        strcat(infile, GZ_SUFFIX);
#endif
    }
    in = gzopen(infile, "rb");
    if (in == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, infile);
        exit(1);
    }
    out = fopen(outfile, "wb");
    if (out == NULL) {
        perror(file);
        exit(1);
    }

    gz_uncompress(in, out);

    unlink(infile);
}